

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  int in_EAX;
  int extraout_EAX;
  Array<char> *this_00;
  
  lVar1 = *(long *)this;
  while ((ulong)((long)__file * 0x20 + lVar1) < *(ulong *)(this + 8)) {
    this_00 = (Array<char> *)(*(ulong *)(this + 8) - 0x20);
    *(Array<char> **)(this + 8) = this_00;
    Array<char>::~Array(this_00);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }